

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O1

void __thiscall
TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test::
~TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test
          (TEST_CommandLineArguments_setExcludeNameFilterSameParameter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeNameFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xnname" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.invertMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}